

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O0

void __thiscall
KarpRabinHash<unsigned_long_long,_unsigned_char>::KarpRabinHash
          (KarpRabinHash<unsigned_long_long,_unsigned_char> *this,int myn,int mywordsize)

{
  unsigned_long_long uVar1;
  int local_1c;
  int i;
  int mywordsize_local;
  int myn_local;
  KarpRabinHash<unsigned_long_long,_unsigned_char> *this_local;
  
  this->hashvalue = 0;
  this->n = myn;
  this->wordsize = mywordsize;
  uVar1 = maskfnc<unsigned_long_long>(this->wordsize);
  CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  uVar1 = maskfnc<unsigned_long_long>(this->wordsize);
  this->HASHMASK = uVar1;
  this->BtoN = 1;
  for (local_1c = 0; local_1c < this->n; local_1c = local_1c + 1) {
    this->BtoN = this->BtoN * 0x25;
    this->BtoN = this->HASHMASK & this->BtoN;
  }
  return;
}

Assistant:

KarpRabinHash(int myn, int mywordsize = 19)
      : hashvalue(0), n(myn), wordsize(mywordsize),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        HASHMASK(maskfnc<hashvaluetype>(wordsize)), BtoN(1) {
    for (int i = 0; i < n; ++i) {
      BtoN *= B;
      BtoN &= HASHMASK;
    }
  }